

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

HashFunction flatbuffers::FindHashFunction16(char *name)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    iVar1 = strcmp(name,*(char **)((long)&kHashFunctions16 + lVar2));
    if (iVar1 == 0) {
      return *(HashFunction *)((long)&PTR_HashFnv1<unsigned_short>_003f1f48 + lVar2);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 == 0x10);
  return (HashFunction)0x0;
}

Assistant:

inline NamedHashFunction<uint16_t>::HashFunction FindHashFunction16(
    const char *name) {
  std::size_t size = sizeof(kHashFunctions16) / sizeof(kHashFunctions16[0]);
  for (std::size_t i = 0; i < size; ++i) {
    if (std::strcmp(name, kHashFunctions16[i].name) == 0) {
      return kHashFunctions16[i].function;
    }
  }
  return nullptr;
}